

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holding_property.cpp
# Opt level: O2

void __thiscall HoldingProperty_MoveTo_Test::TestBody(HoldingProperty_MoveTo_Test *this)

{
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  AssertionResult gtest_ar;
  int local_2c;
  int remembered_value;
  HoldingMovableType obj;
  
  HoldingMovableType::HoldingMovableType(&obj);
  LOCK();
  UNLOCK();
  local_50.ptr_._0_4_ = (anonymous_namespace)::getUID()::_uid_gen + 1;
  (anonymous_namespace)::getUID()::_uid_gen = (anonymous_namespace)::getUID()::_uid_gen + 1;
  remembered_value = local_50.ptr_._0_4_;
  obj.value1.super_PropertyHoldingBase<Movable>.m_value.m_id =
       (PropertyHoldingBase<Movable>)(PropertyHoldingBase<Movable>)local_50.ptr_._0_4_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"remembered_value","obj.value1().getId()",&remembered_value,
             (int *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x1de,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_50.ptr_._0_4_ = 0;
  local_48.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","move_from.getId()",(int *)&local_50,(int *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x1df,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  LOCK();
  UNLOCK();
  local_50.ptr_._0_4_ = (anonymous_namespace)::getUID()::_uid_gen + 1;
  local_2c = 0;
  (anonymous_namespace)::getUID()::_uid_gen = (anonymous_namespace)::getUID()::_uid_gen + 1;
  remembered_value = local_50.ptr_._0_4_;
  obj.value1.super_PropertyHoldingBase<Movable>.m_value.m_id =
       (PropertyHoldingBase<Movable>)(PropertyHoldingBase<Movable>)local_50.ptr_._0_4_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"remembered_value","obj.value1().getId()",&remembered_value,
             (int *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x1e4,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_50.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","move_from_other.id",(int *)&local_50,&local_2c);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x1e5,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(HoldingProperty, MoveTo)
{
  HoldingMovableType obj;
  Movable move_from;
  auto remembered_value = move_from.getId();
  obj.value1 = std::move( move_from );
  EXPECT_EQ( remembered_value, obj.value1().getId() );
  EXPECT_EQ( 0, move_from.getId() );
  
  IdHolder move_from_other;
  remembered_value = move_from_other.id;
  obj.value1 = std::move( move_from_other );
  EXPECT_EQ( remembered_value, obj.value1().getId() );
  EXPECT_EQ( 0, move_from_other.id );
}